

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::PushColumnClipRect(int column_index)

{
  ImGuiOldColumns *pIVar1;
  ImGuiWindow *pIVar2;
  int in_EDI;
  ImVec2 *unaff_retaddr;
  ImGuiOldColumnData *column;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffff8;
  
  pIVar2 = GetCurrentWindowRead();
  pIVar1 = (pIVar2->DC).CurrentColumns;
  if (in_EDI < 0) {
    in_EDI = pIVar1->Current;
  }
  ImVector<ImGuiOldColumnData>::operator[](&pIVar1->Columns,in_EDI);
  PushClipRect(unaff_retaddr,(ImVec2 *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
               SUB81((ulong)pIVar2 >> 0x38,0));
  return;
}

Assistant:

void ImGui::PushColumnClipRect(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (column_index < 0)
        column_index = columns->Current;

    ImGuiOldColumnData* column = &columns->Columns[column_index];
    PushClipRect(column->ClipRect.Min, column->ClipRect.Max, false);
}